

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O0

void Disconnect_Fields(FORM *form)

{
  FIELD **local_18;
  FIELD **fields;
  FORM *form_local;
  
  if (form->field != (FIELD **)0x0) {
    for (local_18 = form->field; *local_18 != (FIELD *)0x0; local_18 = local_18 + 1) {
      if (form == (*local_18)->form) {
        (*local_18)->form = (formnode *)0x0;
      }
    }
    form->cols = 0;
    form->rows = 0;
    form->maxpage = -1;
    form->maxfield = -1;
    form->field = (FIELD **)0x0;
    if (form->page != (_PAGE *)0x0) {
      free(form->page);
    }
    form->page = (_PAGE *)0x0;
  }
  return;
}

Assistant:

static void Disconnect_Fields( FORM * form )
{
  if (form->field)
    {
      FIELD **fields;

      for(fields=form->field;*fields;fields++)
	{
	  if (form == (*fields)->form) 
	    (*fields)->form = (FORM *)0;
	}
      
      form->rows = form->cols = 0;
      form->maxfield = form->maxpage = -1;
      form->field = (FIELD **)0;
      if (form->page) 
	free(form->page);
      form->page = (_PAGE *)0;
    }	
}